

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_set_implemented(lys_module *mod,char **features)

{
  LY_ERR LVar1;
  lys_glob_unres *unres;
  
  if (mod->parsed == (lysp_module *)0x0) {
    LVar1 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","mod->parsed",
           "lys_set_implemented");
  }
  else {
    unres = &mod->ctx->unres;
    LVar1 = _lys_set_implemented(mod,features,unres);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = LY_SUCCESS;
      if ((((mod->ctx->flags & 0x80) == 0) &&
          (LVar1 = lys_unres_dep_sets_create(mod->ctx,&unres->dep_sets,mod), LVar1 == LY_SUCCESS))
         && (LVar1 = lys_compile_depset_all(mod->ctx,unres), LVar1 == LY_SUCCESS)) {
        lys_unres_glob_erase(unres);
        LVar1 = LY_SUCCESS;
      }
    }
    if (LVar1 != LY_SUCCESS) {
      lys_unres_glob_revert(mod->ctx,unres);
      lys_unres_glob_erase(unres);
    }
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_set_implemented(struct lys_module *mod, const char **features)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_glob_unres *unres = &mod->ctx->unres;

    LY_CHECK_ARG_RET(NULL, mod, mod->parsed, LY_EINVAL);

    /* implement */
    ret = _lys_set_implemented(mod, features, unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(mod->ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(mod->ctx, &unres->dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(mod->ctx, unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(mod->ctx, unres);
        lys_unres_glob_erase(unres);
    }
    return ret;
}